

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::Demangle(char *mangled,char *out,size_t out_size)

{
  bool bVar1;
  pointer pcVar2;
  unsigned_long *puVar3;
  _func_void_void_ptr *local_50;
  undefined1 local_48 [8];
  unique_ptr<char,_void_(*)(void_*)_noexcept> unmangled;
  size_t n;
  size_t sStack_28;
  int status;
  size_t out_size_local;
  char *out_local;
  char *mangled_local;
  
  n._4_4_ = -1;
  unmangled._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)_noexcept>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)_noexcept>.super__Head_base<0UL,_char_*,_false>.
  _M_head_impl = (char *)0x0;
  sStack_28 = out_size;
  out_size_local = (size_t)out;
  out_local = mangled;
  pcVar2 = (pointer)__cxa_demangle(mangled,0,
                                   &unmangled._M_t.
                                    super___uniq_ptr_impl<char,_void_(*)(void_*)_noexcept>._M_t.
                                    super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)_noexcept>.
                                    super__Head_base<0UL,_char_*,_false>,(long)&n + 4);
  local_50 = free;
  std::unique_ptr<char,void(*)(void*)noexcept>::unique_ptr<void(*)(void*)noexcept,void>
            ((unique_ptr<char,void(*)(void*)noexcept> *)local_48,pcVar2,&local_50);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)local_48);
  if (bVar1) {
    pcVar2 = std::unique_ptr<char,_void_(*)(void_*)_noexcept>::get
                       ((unique_ptr<char,_void_(*)(void_*)_noexcept> *)local_48);
    puVar3 = std::min<unsigned_long>
                       ((unsigned_long *)
                        &unmangled._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)_noexcept>._M_t.
                         super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)_noexcept>.
                         super__Head_base<0UL,_char_*,_false>,&stack0xffffffffffffffd8);
    std::copy_n<char*,unsigned_long,char*>(pcVar2,*puVar3,(char *)out_size_local);
    mangled_local._7_1_ = n._4_4_ == 0;
  }
  else {
    mangled_local._7_1_ = false;
  }
  std::unique_ptr<char,_void_(*)(void_*)_noexcept>::~unique_ptr
            ((unique_ptr<char,_void_(*)(void_*)_noexcept> *)local_48);
  return (bool)(mangled_local._7_1_ & 1);
}

Assistant:

bool Demangle(const char* mangled, char* out, size_t out_size) {
#if defined(GLOG_OS_WINDOWS)
#  if defined(HAVE_DBGHELP)
  // When built with incremental linking, the Windows debugger
  // library provides a more complicated `Symbol->Name` with the
  // Incremental Linking Table offset, which looks like
  // `@ILT+1105(?func@Foo@@SAXH@Z)`. However, the demangler expects
  // only the mangled symbol, `?func@Foo@@SAXH@Z`. Fortunately, the
  // mangled symbol is guaranteed not to have parentheses,
  // so we search for `(` and extract up to `)`.
  //
  // Since we may be in a signal handler here, we cannot use `std::string`.
  char buffer[1024];  // Big enough for a sane symbol.
  const char* lparen = strchr(mangled, '(');
  if (lparen) {
    // Extract the string `(?...)`
    const char* rparen = strchr(lparen, ')');
    size_t length = static_cast<size_t>(rparen - lparen) - 1;
    strncpy(buffer, lparen + 1, length);
    buffer[length] = '\0';
    mangled = buffer;
  }  // Else the symbol wasn't inside a set of parentheses
  // We use the ANSI version to ensure the string type is always `char *`.
  return UnDecorateSymbolName(mangled, out, out_size, UNDNAME_COMPLETE);
#  else
  (void)mangled;
  (void)out;
  (void)out_size;
  return false;
#  endif
#elif defined(HAVE___CXA_DEMANGLE)
  int status = -1;
  std::size_t n = 0;
  std::unique_ptr<char, decltype(&std::free)> unmangled{
      abi::__cxa_demangle(mangled, nullptr, &n, &status), &std::free};

  if (!unmangled) {
    return false;
  }

  std::copy_n(unmangled.get(), std::min(n, out_size), out);
  return status == 0;
#else
  State state;
  InitState(&state, mangled, out, out_size);
  return ParseTopLevelMangledName(&state) && !state.overflowed;
#endif
}